

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonBlobChangePayloadSize(JsonParse *pParse,u32 i,u32 szPayload)

{
  uint N;
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  u8 *puVar5;
  u32 uVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  byte *__src;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  if (pParse->oom == '\0') {
    puVar5 = pParse->aBlob;
    bVar3 = puVar5[i] >> 4;
    uVar11 = 0xffffffff;
    if (bVar3 != 0xc) {
      uVar11 = (uint)(bVar3 == 0xd) * 2 | 0xfffffffc;
    }
    bVar2 = false;
    if (puVar5[i] < 0xc0) {
      uVar11 = 0;
    }
    bVar12 = false;
    iVar4 = 0;
    if (0xb < szPayload) {
      if (szPayload < 0x100) {
        iVar4 = 1;
        bVar2 = true;
        bVar12 = false;
      }
      else {
        bVar12 = szPayload < 0x10000;
        iVar4 = (uint)!bVar12 * 2 + 2;
        bVar2 = false;
      }
    }
    pbVar9 = puVar5 + i;
    uVar11 = iVar4 + uVar11;
    if (uVar11 != 0) {
      uVar6 = pParse->nBlob;
      N = uVar6 + uVar11;
      if ((int)uVar11 < 1) {
        __src = pbVar9 + (1 - uVar11);
        uVar10 = ~i + uVar6 + uVar11;
        pbVar1 = pbVar9;
      }
      else {
        if (pParse->nBlobAlloc < N) {
          iVar4 = jsonBlobExpand(pParse,N);
          if (iVar4 != 0) goto LAB_0019488c;
          puVar5 = pParse->aBlob;
          uVar6 = pParse->nBlob;
        }
        pbVar9 = puVar5 + i;
        __src = puVar5 + (ulong)i + 1;
        uVar10 = ~i + uVar6;
        pbVar1 = pbVar9 + uVar11;
      }
      memmove(pbVar1 + 1,__src,(ulong)uVar10);
      pParse->nBlob = N;
    }
    bVar3 = *pbVar9 & 0xf;
    bVar7 = (byte)szPayload;
    if (szPayload < 0xc) {
      *pbVar9 = bVar3 | bVar7 << 4;
    }
    else if (bVar2) {
      *pbVar9 = bVar3 | 0xc0;
      pbVar9[1] = bVar7;
    }
    else {
      bVar8 = (byte)(szPayload >> 8);
      if (bVar12) {
        *pbVar9 = bVar3 | 0xd0;
        pbVar9[1] = bVar8;
        pbVar9[2] = bVar7;
      }
      else {
        *pbVar9 = bVar3 | 0xe0;
        pbVar9[1] = (byte)(szPayload >> 0x18);
        pbVar9[2] = (byte)(szPayload >> 0x10);
        pbVar9[3] = bVar8;
        pbVar9[4] = bVar7;
      }
    }
  }
  else {
LAB_0019488c:
    uVar11 = 0;
  }
  return uVar11;
}

Assistant:

static int jsonBlobChangePayloadSize(
  JsonParse *pParse,
  u32 i,
  u32 szPayload
){
  u8 *a;
  u8 szType;
  u8 nExtra;
  u8 nNeeded;
  int delta;
  if( pParse->oom ) return 0;
  a = &pParse->aBlob[i];
  szType = a[0]>>4;
  if( szType<=11 ){
    nExtra = 0;
  }else if( szType==12 ){
    nExtra = 1;
  }else if( szType==13 ){
    nExtra = 2;
  }else{
    nExtra = 4;
  }
  if( szPayload<=11 ){
    nNeeded = 0;
  }else if( szPayload<=0xff ){
    nNeeded = 1;
  }else if( szPayload<=0xffff ){
    nNeeded = 2;
  }else{
    nNeeded = 4;
  }
  delta = nNeeded - nExtra;
  if( delta ){
    u32 newSize = pParse->nBlob + delta;
    if( delta>0 ){
      if( newSize>pParse->nBlobAlloc && jsonBlobExpand(pParse, newSize) ){
        return 0;  /* OOM error.  Error state recorded in pParse->oom. */
      }
      a = &pParse->aBlob[i];
      memmove(&a[1+delta], &a[1], pParse->nBlob - (i+1));
    }else{
      memmove(&a[1], &a[1-delta], pParse->nBlob - (i+1-delta));
    }
    pParse->nBlob = newSize;
  }
  if( nNeeded==0 ){
    a[0] = (a[0] & 0x0f) | (szPayload<<4);
  }else if( nNeeded==1 ){
    a[0] = (a[0] & 0x0f) | 0xc0;
    a[1] = szPayload & 0xff;
  }else if( nNeeded==2 ){
    a[0] = (a[0] & 0x0f) | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
  }else{
    a[0] = (a[0] & 0x0f) | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
  }
  return delta;
}